

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O0

void view_ability_display(menu_conflict *menu,int oid,_Bool cursor,int row,int col,int width)

{
  int iVar1;
  void *pvVar2;
  player_ability *choices;
  char local_78 [7];
  uint8_t color;
  char buf [80];
  int width_local;
  int col_local;
  int row_local;
  _Bool cursor_local;
  int oid_local;
  menu_conflict *menu_local;
  
  pvVar2 = menu->menu_data;
  iVar1 = *(int *)((long)pvVar2 + (long)oid * 0x30 + 0x28);
  buf._76_4_ = width;
  if (iVar1 == 1) {
    strnfmt(local_78,0x50,"Specialty Ability: %s",
            *(undefined8 *)((long)pvVar2 + (long)oid * 0x30 + 0x18));
    choices._7_1_ = '\x05';
  }
  else if (iVar1 == 2) {
    strnfmt(local_78,0x50,"Racial: %s",*(undefined8 *)((long)pvVar2 + (long)oid * 0x30 + 0x18));
    choices._7_1_ = '\x03';
  }
  else if (iVar1 == 3) {
    strnfmt(local_78,0x50,"Class: %s",*(undefined8 *)((long)pvVar2 + (long)oid * 0x30 + 0x18));
    choices._7_1_ = '\a';
  }
  else {
    my_strcpy(local_78,"Mysterious",0x50);
    choices._7_1_ = '\x10';
  }
  if (cursor) {
    choices._7_1_ = '\x01';
  }
  c_put_str(choices._7_1_,local_78,row,col);
  return;
}

Assistant:

static void view_ability_display(struct menu *menu, int oid, bool cursor,
	int row, int col, int width)
{
	char buf[80];
	uint8_t color;
	struct player_ability *choices = menu->menu_data;

	switch (choices[oid].group) {
	case PLAYER_FLAG_SPECIAL:
		{
			strnfmt(buf, sizeof(buf), "Specialty Ability: %s",
				choices[oid].name);
			color = COLOUR_GREEN;
			break;
		}
	case PLAYER_FLAG_CLASS:
		{
			strnfmt(buf, sizeof(buf), "Class: %s",
				choices[oid].name);
			color = COLOUR_UMBER;
			break;
		}
	case PLAYER_FLAG_RACE:
		{
			strnfmt(buf, sizeof(buf), "Racial: %s",
				choices[oid].name);
			color = COLOUR_ORANGE;
			break;
		}
	default:
		{
			my_strcpy(buf, "Mysterious", sizeof(buf));
			color = COLOUR_PURPLE;
		}
	}

	/* Print it */
	c_put_str(cursor ? COLOUR_WHITE : color, buf, row, col);

}